

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline_private.hh
# Opt level: O3

unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> __thiscall
qpdf::pl::create<Pl_PNGFilter,Pl_PNGFilter::action_e,unsigned_int&>
          (pl *this,unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *link,
          action_e *args,uint *args_1)

{
  __uniq_ptr_data<Pipeline,_std::default_delete<Pipeline>,_true,_true> next;
  Link *pLVar1;
  _Tuple_impl<0UL,_Pl_PNGFilter_*,_std::default_delete<Pl_PNGFilter>_> this_00;
  undefined8 *puVar2;
  pointer __p;
  _Head_base<0UL,_Pl_PNGFilter_*,_false> local_40;
  __uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_38;
  
  next.super___uniq_ptr_impl<Pipeline,_std::default_delete<Pipeline>_>._M_t.
  super__Tuple_impl<0UL,_Pipeline_*,_std::default_delete<Pipeline>_>.
  super__Head_base<0UL,_Pipeline_*,_false>._M_head_impl =
       (((link->_M_t).super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>.
         _M_t.super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
         super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl)->next_pl)._M_t.
       super___uniq_ptr_impl<Pipeline,_std::default_delete<Pipeline>_>;
  this_00.super__Head_base<0UL,_Pl_PNGFilter_*,_false>._M_head_impl =
       (_Head_base<0UL,_Pl_PNGFilter_*,_false>)operator_new(0x80);
  Pl_PNGFilter::Pl_PNGFilter
            ((Pl_PNGFilter *)this_00.super__Head_base<0UL,_Pl_PNGFilter_*,_false>._M_head_impl,"",
             (Pipeline *)
             next.super___uniq_ptr_impl<Pipeline,_std::default_delete<Pipeline>_>._M_t.
             super__Tuple_impl<0UL,_Pipeline_*,_std::default_delete<Pipeline>_>.
             super__Head_base<0UL,_Pipeline_*,_false>._M_head_impl,*args,*args_1,1,8);
  local_40._M_head_impl =
       (Pl_PNGFilter *)this_00.super__Head_base<0UL,_Pl_PNGFilter_*,_false>._M_head_impl;
  puVar2 = (undefined8 *)operator_new(0x10);
  pLVar1 = (link->_M_t).super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>.
           _M_t.super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
           super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl;
  (link->_M_t).super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
  super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
  super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl = (Link *)0x0;
  local_40._M_head_impl = (Pl_PNGFilter *)0x0;
  *puVar2 = pLVar1;
  local_38._M_t.super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
  super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
       (tuple<qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>)
       (_Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>)0x0;
  ((_Tuple_impl<0UL,_Pl_PNGFilter_*,_std::default_delete<Pl_PNGFilter>_> *)(puVar2 + 1))->
  super__Head_base<0UL,_Pl_PNGFilter_*,_false> =
       this_00.super__Head_base<0UL,_Pl_PNGFilter_*,_false>._M_head_impl;
  *(undefined8 **)this = puVar2;
  std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr
            ((unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&local_38);
  std::unique_ptr<Pl_PNGFilter,_std::default_delete<Pl_PNGFilter>_>::~unique_ptr
            ((unique_ptr<Pl_PNGFilter,_std::default_delete<Pl_PNGFilter>_> *)&local_40);
  return (__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true>)
         (__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Link>
    create(std::unique_ptr<Link> link, Args&&... args)
    {
        auto* next = link->next_pl.get();
        return std::make_unique<Link>(
            std::move(link), std::make_unique<P>("", next, std::forward<Args>(args)...));
    }